

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

bool Validator::constraintH3(Solution *solution)

{
  pointer pcVar1;
  Turn *this;
  pointer pbVar2;
  pointer pbVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  int iVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *__x;
  vector<Turn_*,_std::allocator<Turn_*>_> *__x_00;
  Nurse *this_00;
  History *this_01;
  string *psVar7;
  Scenario *pSVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
  *pmVar9;
  mapped_type *pmVar10;
  ShiftType *pSVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  _Base_ptr p_Var14;
  bool bVar15;
  pointer ppTVar16;
  string lastShiftString;
  vector<Turn_*,_std::allocator<Turn_*>_> turns;
  ShiftType lastShift;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  nurses;
  key_type local_e8;
  vector<Turn_*,_std::allocator<Turn_*>_> local_c8;
  ShiftType local_b0;
  _Rb_tree_node_base *local_70;
  pointer local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  local_60;
  
  __x = &Solution::getNurses_abi_cxx11_(solution)->_M_t;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  ::_Rb_tree(&local_60,__x);
  bVar15 = true;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var14 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      __x_00 = NurseSolution::getTurns(*(NurseSolution **)(p_Var14 + 2));
      std::vector<Turn_*,_std::allocator<Turn_*>_>::vector(&local_c8,__x_00);
      this_00 = NurseSolution::getNurse(*(NurseSolution **)(p_Var14 + 2));
      this_01 = Nurse::getHistory(this_00);
      psVar7 = History::getLastAssignedShiftType_abi_cxx11_(this_01);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,pcVar1,pcVar1 + psVar7->_M_string_length);
      local_b0.id._M_dataplus._M_p = (pointer)&local_b0.id.field_2;
      local_b0.id._M_string_length = 0;
      local_b0.id.field_2._M_local_buf[0] = '\0';
      local_b0.forbiddenSucceedingShiftTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b0.forbiddenSucceedingShiftTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b0.forbiddenSucceedingShiftTypes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_70 = p_Var14;
      pSVar8 = Scenario::getInstance();
      pmVar9 = Scenario::getShifts_abi_cxx11_(pSVar8);
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                ::at(pmVar9,&local_e8);
      std::__cxx11::string::_M_assign((string *)&local_b0);
      local_b0.minimumNumberOfConsecutiveAssignments =
           pmVar10->minimumNumberOfConsecutiveAssignments;
      local_b0.maximumNumberOfConsecutiveAssignments =
           pmVar10->maximumNumberOfConsecutiveAssignments;
      iVar6 = -1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_b0.forbiddenSucceedingShiftTypes,&pmVar10->forbiddenSucceedingShiftTypes);
      local_68 = local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      ppTVar16 = local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          this = *ppTVar16;
          if (iVar6 == -2) {
            pSVar8 = Scenario::getInstance();
            pmVar9 = Scenario::getShifts_abi_cxx11_(pSVar8);
            pSVar11 = Turn::getShiftType(this);
            psVar7 = ShiftType::getId_abi_cxx11_(pSVar11);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar9,psVar7);
            std::__cxx11::string::_M_assign((string *)&local_b0);
          }
          else {
            pvVar12 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&local_b0);
            pbVar2 = (pvVar12->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pvVar12 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&local_b0);
            pbVar3 = (pvVar12->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pSVar11 = Turn::getShiftType(this);
            psVar7 = ShiftType::getId_abi_cxx11_(pSVar11);
            _Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               (pbVar2,pbVar3,psVar7);
            pvVar12 = ShiftType::getForbiddenSucceedingShiftTypes_abi_cxx11_(&local_b0);
            if ((_Var13._M_current !=
                 (pvVar12->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) &&
               (iVar5 = Turn::getDay(this), iVar6 == iVar5 + -1)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_b0.forbiddenSucceedingShiftTypes);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0.id._M_dataplus._M_p != &local_b0.id.field_2) {
                operator_delete(local_b0.id._M_dataplus._M_p,
                                CONCAT71(local_b0.id.field_2._M_allocated_capacity._1_7_,
                                         local_b0.id.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                (long)local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              bVar15 = false;
              goto LAB_0011347a;
            }
            pSVar8 = Scenario::getInstance();
            pmVar9 = Scenario::getShifts_abi_cxx11_(pSVar8);
            pSVar11 = Turn::getShiftType(this);
            psVar7 = ShiftType::getId_abi_cxx11_(pSVar11);
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ShiftType>_>_>
                      ::at(pmVar9,psVar7);
            std::__cxx11::string::_M_assign((string *)&local_b0);
          }
          local_b0.minimumNumberOfConsecutiveAssignments =
               pmVar10->minimumNumberOfConsecutiveAssignments;
          local_b0.maximumNumberOfConsecutiveAssignments =
               pmVar10->maximumNumberOfConsecutiveAssignments;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&local_b0.forbiddenSucceedingShiftTypes,
                      &pmVar10->forbiddenSucceedingShiftTypes);
          iVar6 = Turn::getDay(this);
          ppTVar16 = ppTVar16 + 1;
        } while (ppTVar16 != local_68);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b0.forbiddenSucceedingShiftTypes);
      bVar15 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.id._M_dataplus._M_p != &local_b0.id.field_2) {
        operator_delete(local_b0.id._M_dataplus._M_p,
                        CONCAT71(local_b0.id.field_2._M_allocated_capacity._1_7_,
                                 local_b0.id.field_2._M_local_buf[0]) + 1);
      }
      p_Var4 = local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var14 != &local_60._M_impl.super__Rb_tree_header);
  }
LAB_0011347a:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  ::~_Rb_tree(&local_60);
  return bVar15;
}

Assistant:

bool Validator::constraintH3(const Solution &solution) {
    map<string, NurseSolution *> nurses = solution.getNurses();
    for(auto const &nurse : nurses)
    {
        vector<Turn *> turns = nurse.second->getTurns();

        string lastShiftString = nurse.second->getNurse()->getHistory().getLastAssignedShiftType();

        int lastDay;
        ShiftType lastShift;

        try {

            lastShift = Scenario::getInstance()->getShifts().at(lastShiftString);
            lastDay = -1;
        }
        catch(const std::exception& e)
        {
            lastDay = -2;
        }

        for(Turn * turn : turns){
            if(lastDay == -2) {
                lastShift = Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId());
                lastDay = turn->getDay();
            }
            else if(find(lastShift.getForbiddenSucceedingShiftTypes().begin(), lastShift.getForbiddenSucceedingShiftTypes().end(), turn->getShiftType()->getId()) == lastShift.getForbiddenSucceedingShiftTypes().end()
               || lastDay != (turn->getDay() - 1)){
                lastShift = Scenario::getInstance()->getShifts().at(turn->getShiftType()->getId());
                lastDay = turn->getDay();
            }
            else
            {
                return false;
            }
        }
    }
    return true;
}